

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::InstallCompactionResults(DBImpl *this,CompactionState *compact)

{
  long lVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  long *in_RDX;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = (uint *)*in_RDX;
  Log((Logger *)compact[1].smallest_snapshot,"Compacted %d@%d + %d@%d files => %lld bytes",
      (ulong)(*(long *)(puVar4 + 0x32) - *(long *)(puVar4 + 0x30)) >> 3,(ulong)*puVar4,
      (ulong)(*(long *)(puVar4 + 0x38) - *(long *)(puVar4 + 0x36)) >> 3,(ulong)(*puVar4 + 1),
      in_RDX[7]);
  Compaction::AddInputDeletions((Compaction *)*in_RDX,&((Compaction *)*in_RDX)->edit_);
  lVar5 = in_RDX[2];
  if (in_RDX[3] != lVar5) {
    iVar2 = *(int *)*in_RDX;
    lVar6 = 0x30;
    uVar7 = 0;
    do {
      lVar1 = lVar5 + lVar6;
      VersionEdit::AddFile
                ((VersionEdit *)(*in_RDX + 0x18),iVar2 + 1,*(uint64_t *)(lVar1 + -0x30),
                 *(uint64_t *)(lVar1 + -0x28),(InternalKey *)(lVar1 + -0x20),
                 (InternalKey *)(lVar5 + lVar6));
      uVar7 = uVar7 + 1;
      lVar5 = in_RDX[2];
      lVar6 = lVar6 + 0x50;
    } while (uVar7 < (ulong)((in_RDX[3] - lVar5 >> 4) * -0x3333333333333333));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    VersionSet::LogAndApply
              ((VersionSet *)this,(VersionEdit *)compact[8].outfile,(Mutex *)(*in_RDX + 0x18));
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::InstallCompactionResults(CompactionState* compact) {
  mutex_.AssertHeld();
  Log(options_.info_log, "Compacted %d@%d + %d@%d files => %lld bytes",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1), compact->compaction->level() + 1,
      static_cast<long long>(compact->total_bytes));

  // Add compaction outputs
  compact->compaction->AddInputDeletions(compact->compaction->edit());
  const int level = compact->compaction->level();
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    compact->compaction->edit()->AddFile(level + 1, out.number, out.file_size,
                                         out.smallest, out.largest);
  }
  return versions_->LogAndApply(compact->compaction->edit(), &mutex_);
}